

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

ParserResult *
Catch::Clara::Detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  bool bVar4;
  string srcLC;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  toLower(&local_88,source);
  iVar3 = std::__cxx11::string::compare((char *)&local_88);
  bVar4 = true;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&local_88);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)&local_88);
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&local_88);
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&local_88);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)&local_88);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)&local_88);
              if (iVar3 != 0) {
                iVar3 = std::__cxx11::string::compare((char *)&local_88);
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::string::compare((char *)&local_88);
                  if (iVar3 != 0) {
                    iVar3 = std::__cxx11::string::compare((char *)&local_88);
                    if (iVar3 != 0) {
                      std::operator+(&local_48,"Expected a boolean value but did not recognise: \'",
                                     source);
                      std::operator+(&local_68,&local_48,'\'');
                      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>)
                      .super_ResultBase.m_type = RuntimeError;
                      (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>)
                      .super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
                      paVar1 = &(__return_storage_ptr__->m_errorMessage).field_2;
                      (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p = (pointer)paVar1;
                      paVar2 = &local_68.field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_68._M_dataplus._M_p == paVar2) {
                        paVar1->_M_allocated_capacity =
                             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                      local_68.field_2._M_local_buf[0]);
                        *(undefined8 *)((long)&(__return_storage_ptr__->m_errorMessage).field_2 + 8)
                             = local_68.field_2._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
                             local_68._M_dataplus._M_p;
                        (__return_storage_ptr__->m_errorMessage).field_2._M_allocated_capacity =
                             CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                      local_68.field_2._M_local_buf[0]);
                      }
                      (__return_storage_ptr__->m_errorMessage)._M_string_length =
                           local_68._M_string_length;
                      local_68._M_string_length = 0;
                      local_68.field_2._M_local_buf[0] = '\0';
                      local_68._M_dataplus._M_p = (pointer)paVar2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_48._M_dataplus._M_p != &local_48.field_2) {
                        operator_delete(local_48._M_dataplus._M_p,
                                        local_48.field_2._M_allocated_capacity + 1);
                      }
                      goto LAB_00143606;
                    }
                  }
                }
              }
            }
            bVar4 = false;
          }
        }
      }
    }
  }
  *target = bVar4;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_001b2540;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00143606:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto( std::string const& source,
                                      bool& target ) {
                std::string srcLC = toLower( source );

                if ( srcLC == "y" || srcLC == "1" || srcLC == "true" ||
                     srcLC == "yes" || srcLC == "on" ) {
                    target = true;
                } else if ( srcLC == "n" || srcLC == "0" || srcLC == "false" ||
                            srcLC == "no" || srcLC == "off" ) {
                    target = false;
                } else {
                    return ParserResult::runtimeError(
                        "Expected a boolean value but did not recognise: '" +
                        source + '\'' );
                }
                return ParserResult::ok( ParseResultType::Matched );
            }